

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_regmat_cnt(char *fn)

{
  int32 iVar1;
  uint local_48;
  uint local_44;
  uint32 k;
  uint32 j;
  uint32 f;
  uint32 c;
  uint32 *veclen;
  uint32 n_feat;
  uint32 n_mllr_class;
  float32 ***regr;
  float32 ****regl;
  char *fn_local;
  
  regl = (float32 ****)fn;
  iVar1 = read_reg_mat(fn,(uint32 **)&f,(uint32 *)((long)&veclen + 4),(uint32 *)&veclen,
                       (float32 *****)&regr,(float32 ****)&n_feat);
  if (iVar1 == 0) {
    for (j = 0; j < veclen._4_4_; j = j + 1) {
      for (k = 0; k < (uint)veclen; k = k + 1) {
        printf("%d\n",(ulong)_f[k]);
        for (local_44 = 0; local_44 < _f[k]; local_44 = local_44 + 1) {
          local_48 = 0;
          while( true ) {
            if (_f[k] <= local_48) break;
            printf("%f ",(double)*(float *)(*(long *)(regr[j][k] + (ulong)local_44 * 2) +
                                           (ulong)local_48 * 4));
            local_48 = local_48 + 1;
          }
          printf("\n");
        }
        local_44 = 0;
        while( true ) {
          if (_f[k] <= local_44) break;
          printf("%f ",(double)(float)_n_feat[j][k][local_44]);
          local_44 = local_44 + 1;
        }
        printf("\n");
        local_44 = 0;
        while( true ) {
          if (_f[k] <= local_44) break;
          printf("1.0 ");
          local_44 = local_44 + 1;
        }
        printf("\n");
      }
    }
    ckd_free(_f);
    free_mllr_reg((float32 *****)&regr,(float32 ****)&n_feat,veclen._4_4_,(uint)veclen);
    fn_local._4_4_ = 0;
  }
  else {
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int
print_regmat_cnt(const char *fn)
{
    float32 ****regl;
    float32 ***regr;
    uint32 n_mllr_class;
    uint32 n_feat;
    uint32 *veclen;
    uint32 c, f, j, k;

    if (read_reg_mat (fn, &veclen, &n_mllr_class, &n_feat, &regl, &regr) != S3_SUCCESS) {
	return S3_ERROR;
    }

    for (c = 0; c < n_mllr_class; c++) {
	for (f = 0; f < n_feat; f++) {
	    printf("%d\n", veclen[f]); 
	    for (j = 0; j < veclen[f]; j++) {
		for (k = 0; k < veclen[f]; ++k) {
		    printf("%f ", regl[c][f][j][k]);
		}
		printf("\n");
	    }
	    for (j = 0; j < veclen[f]; j++) {
		printf("%f ", regr[c][f][j]);
	    }
	    printf("\n");
	    /* Identity transform for variances. */
	    for (j = 0; j < veclen[f]; j++) {
		printf("1.0 ");
	    }
	    printf("\n");
	}
    }
    ckd_free(veclen);

    free_mllr_reg(&regl, &regr, n_mllr_class, n_feat);

    return S3_SUCCESS;
}